

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_promise.cpp
# Opt level: O1

void test(void)

{
  promise<int> p;
  int expected_result;
  future<int> f;
  future_error e;
  promise<int> local_b0;
  long local_98;
  undefined8 local_90;
  undefined8 local_68;
  storage_type local_58;
  
  std::
  __shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<std::experimental::v1::detail::asynchronous_state<int>>>
            ((__shared_ptr<std::experimental::v1::detail::asynchronous_state<int>,(__gnu_cxx::_Lock_policy)2>
              *)&local_b0,
             (allocator<std::experimental::v1::detail::asynchronous_state<int>_> *)&local_98);
  std::experimental::v1::promise<int>::get_async_future((promise<int> *)&local_58.__align);
  local_68 = 0;
  local_98 = local_58._0_8_;
  local_90 = local_58._8_8_;
  if (local_58._0_8_ == 0) {
    __assert_fail("f.valid()",
                  "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_promise.cpp"
                  ,0xd,"void test()");
  }
  std::experimental::v1::promise<int>::get_future((future<int> *)&local_58.__align,&local_b0);
  __assert_fail("0",
                "/workspace/llm4binary/github/license_c_cmakelists/jaredhoberock[P]future/test_promise.cpp"
                ,0x12,"void test()");
}

Assistant:

void test()
{
  {
    // test non-void get_future
    std::experimental::promise<int> p;

    std::experimental::future<int> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<int> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void get_future
    std::experimental::promise<void> p;

    std::experimental::future<void> f = p.get_future();

    assert(f.valid());

    try
    {
      std::experimental::future<void> f = p.get_future();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::future_already_retrieved);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test non-void set_value() / .get()
    std::experimental::promise<int> p;

    int expected_result = 13;
    p.set_value(expected_result);

    int result = p.get_future().get();

    assert(expected_result == result);
  }

  {
    // test void set_value() / .get();
    std::experimental::promise<void> p;

    p.set_value();

    p.get_future().get();
  }

  {
    // test non-void superfluous set_value()
    std::experimental::promise<int> p;

    p.set_value(13);

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value(13);
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }

  {
    // test void superfluous set_value()
    std::experimental::promise<void> p;

    p.set_value();

    try
    {
      // calling set_value() again should throw promise_already_satisfied
      p.set_value();
      assert(0);
    }
    catch(std::future_error e)
    {
      assert(e.code() == std::future_errc::promise_already_satisfied);
    }
    catch(...)
    {
      assert(0);
    }
  }
}